

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_commitment_parse
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *input)

{
  int iVar1;
  undefined1 local_a8 [8];
  secp256k1_ge ge;
  secp256k1_fe x;
  uchar *input_local;
  secp256k1_pedersen_commitment *commit_local;
  secp256k1_context *ctx_local;
  
  if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"commit != NULL");
  }
  else if (input == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"input != NULL");
  }
  else if ((((*input & 0xfe) == 8) &&
           (iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)&ge.infinity,input + 1), iVar1 != 0)) &&
          (iVar1 = secp256k1_ge_set_xquad((secp256k1_ge *)local_a8,(secp256k1_fe *)&ge.infinity),
          iVar1 != 0)) {
    if ((*input & 1) != 0) {
      secp256k1_ge_neg((secp256k1_ge *)local_a8,(secp256k1_ge *)local_a8);
    }
    secp256k1_pedersen_commitment_save(commit,(secp256k1_ge *)local_a8);
    return 1;
  }
  return 0;
}

Assistant:

int secp256k1_pedersen_commitment_parse(const secp256k1_context* ctx, secp256k1_pedersen_commitment* commit, const unsigned char *input) {
    secp256k1_fe x;
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(input != NULL);
    (void) ctx;

    if ((input[0] & 0xFE) != 8 ||
        !secp256k1_fe_set_b32(&x, &input[1]) ||
        !secp256k1_ge_set_xquad(&ge, &x)) {
        return 0;
    }
    if (input[0] & 1) {
        secp256k1_ge_neg(&ge, &ge);
    }
    secp256k1_pedersen_commitment_save(commit, &ge);
    return 1;
}